

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

JavascriptMethod Js::InterpreterStackFrame::EnsureDynamicInterpreterThunk(ScriptFunction *function)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionBody *this;
  FunctionEntryPointInfo *entryPointInfo;
  JavascriptMethod entryPoint;
  ProxyEntryPointInfo *pPVar4;
  JavascriptMethod p_Var5;
  
  if (function == (ScriptFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x6ed,"(function)","function");
    if (!bVar2) goto LAB_0089972f;
    *puVar3 = 0;
  }
  this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)function);
  entryPointInfo = ScriptFunction::GetFunctionEntryPointInfo(function);
  entryPoint = FunctionBody::EnsureDynamicInterpreterThunk(this,entryPointInfo);
  pPVar4 = ScriptFunction::GetEntryPointInfo(function);
  p_Var5 = FunctionProxy::GetDirectEntryPoint((FunctionProxy *)this,pPVar4);
  if (p_Var5 == DelayDynamicInterpreterThunk || p_Var5 == AsmJsDelayDynamicInterpreterThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x6f0,
                                "(!IsDelayDynamicInterpreterThunk(functionBody->GetDirectEntryPoint(function->GetEntryPointInfo())))"
                                ,
                                "!IsDelayDynamicInterpreterThunk(functionBody->GetDirectEntryPoint(function->GetEntryPointInfo()))"
                               );
    if (!bVar2) goto LAB_0089972f;
    *puVar3 = 0;
  }
  p_Var5 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
  if (p_Var5 == DelayDynamicInterpreterThunk) {
    pPVar4 = ScriptFunction::GetEntryPointInfo(function);
    p_Var5 = FunctionProxy::GetDirectEntryPoint((FunctionProxy *)this,pPVar4);
    if (p_Var5 != entryPoint) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x6f5,
                                  "(functionBody->GetDirectEntryPoint(function->GetEntryPointInfo()) == entrypoint)"
                                  ,
                                  "functionBody->GetDirectEntryPoint(function->GetEntryPointInfo()) == entrypoint"
                                 );
      if (!bVar2) {
LAB_0089972f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pPVar4 = ScriptFunction::GetEntryPointInfo(function);
    ScriptFunction::ChangeEntryPoint(function,pPVar4,entryPoint);
  }
  return entryPoint;
}

Assistant:

JavascriptMethod InterpreterStackFrame::EnsureDynamicInterpreterThunk(Js::ScriptFunction * function)
    {
#if DYNAMIC_INTERPRETER_THUNK
        Assert(function);
        Js::FunctionBody *functionBody = function->GetFunctionBody();
        JavascriptMethod entrypoint = functionBody->EnsureDynamicInterpreterThunk(function->GetFunctionEntryPointInfo());
        Assert(!IsDelayDynamicInterpreterThunk(functionBody->GetDirectEntryPoint(function->GetEntryPointInfo())));
        if (function->GetEntryPoint() == InterpreterStackFrame::DelayDynamicInterpreterThunk)
        {
            // If we are not profiling, or the function object is not cross site, this is the direct entry point.
            // Change the entry point on the object
            Assert(functionBody->GetDirectEntryPoint(function->GetEntryPointInfo()) == entrypoint);
            function->ChangeEntryPoint(function->GetEntryPointInfo(), entrypoint);
        }
        // Return the original entry point to be called
        return entrypoint;
#else
        return function->GetEntryPoint();
#endif
    }